

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::ZConsVisitor::ZConsVisitor(ZConsVisitor *this,SimInfo *info)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Globals *pGVar3;
  pointer ppZVar4;
  pointer ppZVar5;
  bool bVar6;
  Molecule *pMVar7;
  Atom *pAVar8;
  _Base_ptr p_Var9;
  ZConsReader *this_00;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  pointer ppAVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> stamp;
  string local_70;
  string local_50;
  
  (this->super_BaseVisitor).visitorName._M_dataplus._M_p =
       (pointer)&(this->super_BaseVisitor).visitorName.field_2;
  (this->super_BaseVisitor).visitorName._M_string_length = 0;
  (this->super_BaseVisitor).visitorName.field_2._M_local_buf[0] = '\0';
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__ZConsVisitor_00288678;
  (this->zconsPos).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->zconsPos).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->zconsPos).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->zmolStates_)._M_t._M_impl.super__Rb_tree_header;
  (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->zconsFilename_)._M_dataplus._M_p = (pointer)&(this->zconsFilename_).field_2;
  (this->zconsFilename_)._M_string_length = 0;
  (this->zconsFilename_).field_2._M_local_buf[0] = '\0';
  this->zconsReader_ = (ZConsReader *)0x0;
  this->info_ = info;
  p_Var2 = &(this->zatomToZmol_)._M_t._M_impl.super__Rb_tree_header;
  (this->zatomToZmol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->zatomToZmol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->zatomToZmol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->zatomToZmol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->zatomToZmol_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::assign((char *)&(this->super_BaseVisitor).visitorName);
  this->currSnapshot_ = this->info_->sman_->currentSnapshot_;
  pGVar3 = this->info_->simParams_;
  if ((pGVar3->ZconsTime).super_ParameterBase.empty_ == false) {
    this->zconsTime_ = (pGVar3->ZconsTime).data_;
  }
  else {
    memcpy(&painCave,"ZConstraint error: If you use a ZConstraint,\n\tyou must set zconsTime.\n",
           0x47);
    painCave.isFatal = 1;
    simError();
  }
  if ((pGVar3->ZconsTol).super_ParameterBase.empty_ == false) {
    this->zconsTol_ = (pGVar3->ZconsTol).data_;
  }
  else {
    this->zconsTol_ = 0.01;
    snprintf(painCave.errMsg,2000,
             "ZConstraint Warning: Tolerance for z-constraint method is not specified.\n\tOpenMD will use a default value of %f.\n\tTo set the tolerance, use the zconsTol variable.\n"
             ,0x47ae147b);
    painCave.isFatal = 0;
    simError();
  }
  ppZVar4 = (pGVar3->zconstraints_).
            super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppZVar5 = (pGVar3->zconstraints_).
            super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::vector
            (&stamp,&pGVar3->zconstraints_);
  uVar11 = (ulong)((long)ppZVar5 - (long)ppZVar4) >> 3;
  uVar10 = 0;
  uVar12 = uVar11 & 0xffffffff;
  if ((int)uVar11 < 1) {
    uVar12 = uVar10;
  }
  for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
    local_a8._M_dataplus._M_p =
         (pointer)((ulong)*(uint *)&(stamp.
                                     super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar10]->MolIndex).
                                    super_ParameterBase.field_0x2c | 0x100000000);
    std::
    _Rb_tree<int,std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>,std::_Select1st<std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>>>
    ::_M_emplace_unique<std::pair<int,OpenMD::ZConsVisitor::ZConsState>>
              ((_Rb_tree<int,std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>,std::_Select1st<std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>>>
                *)&this->zmolStates_,(pair<int,_OpenMD::ZConsVisitor::ZConsState> *)&local_a8);
  }
  for (p_Var9 = (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != p_Var1; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    pMVar7 = SimInfo::getMoleculeByGlobalIndex(this->info_,p_Var9[1]._M_color);
    ppAVar13 = (pMVar7->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (ppAVar13 ==
          (pMVar7->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pAVar8 = (Atom *)0x0;
      }
      else {
        pAVar8 = *ppAVar13;
      }
      ppAVar13 = ppAVar13 + 1;
      if (pAVar8 == (Atom *)0x0) break;
      local_a8._M_dataplus._M_p =
           (pointer)CONCAT44(pMVar7->globalIndex_,(pAVar8->super_StuntDouble).globalIndex_);
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_emplace_unique<std::pair<int,int>>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)&this->zatomToZmol_,(pair<int,_int> *)&local_a8);
    }
  }
  std::__cxx11::string::string((string *)&local_70,(string *)&this->info_->finalConfigFileName_);
  getPrefix(&local_50,&local_70);
  std::operator+(&local_a8,&local_50,".fz");
  std::__cxx11::string::operator=((string *)&this->zconsFilename_,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = (ZConsReader *)operator_new(0x248);
  ZConsReader::ZConsReader(this_00,info);
  this->zconsReader_ = this_00;
  bVar6 = ZConsReader::hasNextFrame(this_00);
  if (bVar6) {
    ZConsReader::readNextFrame(this->zconsReader_);
  }
  std::_Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::~_Vector_base
            (&stamp.super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>)
  ;
  return;
}

Assistant:

ZConsVisitor::ZConsVisitor(SimInfo* info) :
      BaseVisitor(), zconsReader_(NULL), info_(info) {
    visitorName       = "ZConsVisitor";
    currSnapshot_     = info_->getSnapshotManager()->getCurrentSnapshot();
    Globals* simParam = info_->getSimParams();

    if (simParam->haveZconsTime()) {
      zconsTime_ = simParam->getZconsTime();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZConstraint error: If you use a ZConstraint,\n"
               "\tyou must set zconsTime.\n");
      painCave.isFatal = 1;
      simError();
    }

    if (simParam->haveZconsTol()) {
      zconsTol_ = simParam->getZconsTol();
    } else {
      zconsTol_ = 0.01;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZConstraint Warning: Tolerance for z-constraint method is not "
               "specified.\n"
               "\tOpenMD will use a default value of %f.\n"
               "\tTo set the tolerance, use the zconsTol variable.\n",
               zconsTol_);
      painCave.isFatal = 0;
      simError();
    }

    int nZconstraints              = simParam->getNZconsStamps();
    std::vector<ZConsStamp*> stamp = simParam->getZconsStamps();
    for (int i = 0; i < nZconstraints; i++) {
      int zmolIndex = stamp[i]->getMolIndex();
      zmolStates_.insert(std::make_pair(zmolIndex, zsMoving));
    }

    // fill zatomToZmol_ array
    /** @todo only works for single version now*/
    std::map<int, ZConsState>::iterator j;
    for (j = zmolStates_.begin(); j != zmolStates_.end(); ++j) {
      Molecule* mol = info_->getMoleculeByGlobalIndex(j->first);
      assert(mol != NULL);
      Molecule::AtomIterator ai;
      Atom* at;
      for (at = mol->beginAtom(ai); at != NULL; at = mol->nextAtom(ai)) {
        zatomToZmol_.insert(
            std::make_pair(at->getGlobalIndex(), mol->getGlobalIndex()));
      }
    }

    zconsFilename_ = getPrefix(info_->getFinalConfigFileName()) + ".fz";

    zconsReader_ = new ZConsReader(info);

    if (zconsReader_->hasNextFrame()) zconsReader_->readNextFrame();
  }